

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_avx2.c
# Opt level: O0

void aom_get_blk_sse_sum_avx2(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  int16_t *in_RDI;
  int *in_R8;
  int64_t *in_R9;
  int in_stack_00000154;
  int64_t *in_stack_00000158;
  int *in_stack_00000160;
  int in_stack_00000168;
  int in_stack_0000016c;
  int16_t *in_stack_00000170;
  int64_t *in_stack_00000178;
  int *in_stack_00000180;
  int in_stack_00000188;
  int in_stack_0000018c;
  int16_t *in_stack_00000190;
  
  *in_R8 = 0;
  *in_R9 = 0;
  if ((in_ECX & 3) == 0) {
    if (in_EDX == 4) {
      sse_sum_wd4_avx2(in_stack_00000190,in_stack_0000018c,in_stack_00000188,in_stack_00000180,
                       in_stack_00000178);
    }
    else if (in_EDX == 8) {
      sse_sum_wd8_avx2(in_stack_00000190,in_stack_0000018c,in_stack_00000188,in_stack_00000180,
                       in_stack_00000178);
    }
    else if ((in_EDX == 0x10) || (in_EDX == 0x20)) {
      sse_sum_wd16_avx2(in_stack_00000170,in_stack_0000016c,in_stack_00000168,in_stack_00000160,
                        in_stack_00000158,in_stack_00000154);
    }
    else if (in_EDX == 0x40) {
      if ((int)in_ECX < 0x21) {
        sse_sum_wd16_avx2(in_stack_00000170,in_stack_0000016c,in_stack_00000168,in_stack_00000160,
                          in_stack_00000158,in_stack_00000154);
      }
      else {
        sse_sum_wd16_avx2(in_stack_00000170,in_stack_0000016c,in_stack_00000168,in_stack_00000160,
                          in_stack_00000158,in_stack_00000154);
        sse_sum_wd16_avx2(in_stack_00000170,in_stack_0000016c,in_stack_00000168,in_stack_00000160,
                          in_stack_00000158,in_stack_00000154);
      }
    }
    else {
      aom_get_blk_sse_sum_c(in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9);
    }
  }
  else {
    aom_get_blk_sse_sum_c(in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9);
  }
  return;
}

Assistant:

void aom_get_blk_sse_sum_avx2(const int16_t *data, int stride, int bw, int bh,
                              int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;

  if ((bh & 3) == 0) {
    switch (bw) {
        // For smaller block widths, compute multiple rows simultaneously.
      case 4: sse_sum_wd4_avx2(data, stride, bh, x_sum, x2_sum); break;
      case 8: sse_sum_wd8_avx2(data, stride, bh, x_sum, x2_sum); break;
      case 16:
      case 32:
        sse_sum_wd16_avx2(data, stride, bh, x_sum, x2_sum, bw >> 4);
        break;
      case 64:
        // 32-bit variables will overflow for 64 rows at a single time, so
        // compute 32 rows at a time.
        if (bh <= 32) {
          sse_sum_wd16_avx2(data, stride, bh, x_sum, x2_sum, bw >> 4);
        } else {
          sse_sum_wd16_avx2(data, stride, 32, x_sum, x2_sum, bw >> 4);
          sse_sum_wd16_avx2(data + 32 * stride, stride, 32, x_sum, x2_sum,
                            bw >> 4);
        }
        break;

      default: aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
    }
  } else {
    aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
  }
}